

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_scientific.h
# Opt level: O0

void __thiscall
icu_63::numparse::impl::ScientificMatcher::ScientificMatcher(ScientificMatcher *this)

{
  ScientificMatcher *this_local;
  
  NumberParseMatcher::NumberParseMatcher(&this->super_NumberParseMatcher);
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__ScientificMatcher_004a0280;
  UnicodeString::UnicodeString(&this->fExponentSeparatorString);
  DecimalMatcher::DecimalMatcher(&this->fExponentMatcher);
  UnicodeString::UnicodeString(&this->fCustomMinusSign);
  UnicodeString::UnicodeString(&this->fCustomPlusSign);
  return;
}

Assistant:

ScientificMatcher() = default;